

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_KillMaster
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int selector;
  AActor *killtarget;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *source;
  AActor *inflictor;
  AActor *origin;
  int selector_00;
  int flags;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  PClassActor *local_40;
  FName local_38;
  FName local_34;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003e1071;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e1042:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e1071:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x17c4,
                  "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003e0e8f;
    pPVar3 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (origin->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar6 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar6) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e1071;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003e1042;
LAB_003e0e8f:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e10ff:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c5,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = param[1].field_0.i;
LAB_003e0ee4:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e111e:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c6,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    flags = param[2].field_0.i;
LAB_003e0ef3:
    if (param[3].field_0.field_3.Type != '\x03') {
LAB_003e104b:
      pcVar4 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e1052:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c7,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = (PClassActor *)param[3].field_0.field_1.a;
    if (param[3].field_0.field_1.atag != 1) {
      if (local_40 != (PClassActor *)0x0) goto LAB_003e104b;
      local_40 = (PClassActor *)0x0;
    }
LAB_003e0f15:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e10ce:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c8,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar5 = param[4].field_0.i;
LAB_003e0f24:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e10af:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c9,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[5].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e10ff;
    }
    iVar2 = param[1].field_0.i;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e0ee4;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e111e;
    }
    flags = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003e0ef3;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (local_40 = (PClassActor *)param[3].field_0.field_1.a,
       local_40 != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar4 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e1052;
    }
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003e0f15;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e10ce;
    }
    iVar5 = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003e0f24;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e10af;
    }
    selector_00 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e1090;
      }
      goto LAB_003e0f46;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e1090:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x17ca,
                  "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003e0f46:
  selector = param[6].field_0.i;
  source = COPY_AAPTR(origin,selector_00);
  inflictor = COPY_AAPTR(origin,selector);
  killtarget = (origin->master).field_0.p;
  if (killtarget != (AActor *)0x0) {
    if (((killtarget->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      local_38.Index = iVar5;
      local_34.Index = iVar2;
      DoKill(killtarget,inflictor,source,&local_34,flags,local_40,&local_38);
    }
    else {
      (origin->master).field_0.p = (AActor *)0x0;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KillMaster)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src); 
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->master != NULL)
		DoKill(self->master, inflictor, source, damagetype, flags, filter, species);
	return 0;
}